

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O2

CHAR LocalRegionGrayValuePredictTI(IplImage *pImage)

{
  INT32U IVar1;
  CHAR CVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  
  IVar1 = pImage->widthStep;
  iVar5 = IVar1 + 1;
  uVar4 = 300;
  iVar3 = 0;
  for (iVar6 = 1; iVar6 != 5; iVar6 = iVar6 + 1) {
    for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
      uVar8 = pImage->imageData[(uint)(iVar5 + (int)lVar7)] ^ 0xff;
      iVar3 = iVar3 + uVar8;
      if (uVar8 <= uVar4) {
        uVar4 = uVar8;
      }
    }
    iVar5 = iVar5 + IVar1;
  }
  iVar5 = IVar1 + 9;
  for (iVar6 = 1; iVar6 != 5; iVar6 = iVar6 + 1) {
    for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
      uVar8 = pImage->imageData[(uint)(iVar5 + (int)lVar7)] ^ 0xff;
      iVar3 = iVar3 + uVar8;
      if (uVar8 <= uVar4) {
        uVar4 = uVar8;
      }
    }
    iVar5 = iVar5 + IVar1;
  }
  CVar2 = 'I';
  if (0x524 < uVar4 * -0x24 + iVar3) {
    CVar2 = 'T';
  }
  return CVar2;
}

Assistant:

CHAR LocalRegionGrayValuePredictTI(IplImage *pImage) {
    INT32U row, col, locate_value, sum_value = 0, min_value = 300;
//    区域 [1:5,1:6], 4*5
    for (row = 1; row < 5; row++) {
        for (col = 1; col < 6; col++) {
            // get the pixel, 黑白颠倒
            locate_value = (INT32U) (255 - pImage->imageData[row * pImage->widthStep + col]);
            sum_value += locate_value;
            if (locate_value < min_value) {
                min_value = locate_value;
            }
        }
    }
//    区域 [1:5,9:14],4*4
    for (row = 1; row < 5; row++) {
        for (col = 9; col < 14; col++) {
            // get the pixel, 黑白颠倒
            locate_value = (INT32U) (255 - pImage->imageData[row * pImage->widthStep + col]);
            sum_value += locate_value;
            if (locate_value < min_value) {
                min_value = locate_value;
            }
        }
    }
//    总共40个像素点：4*5+4*4=36
//    printf("%d,%d,%d\n",sum_value,min_value,(sum_value-min_value*36));
    if (sum_value - min_value * 36 > 1316)
        return 'T';
    else
        return 'I';
}